

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O2

void __thiscall
QPDFExc::QPDFExc(QPDFExc *this,qpdf_error_code_e error_code,string *filename,string *object,
                qpdf_offset_t offset,string *message,bool zero_offset_valid)

{
  qpdf_offset_t offset_00;
  string local_50;
  
  offset_00 = -1;
  if (zero_offset_valid) {
    offset_00 = offset;
  }
  if (offset != 0) {
    offset_00 = offset;
  }
  createWhat(&local_50,filename,object,offset_00,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__QPDFExc_002ade00;
  this->error_code = error_code;
  std::__cxx11::string::string((string *)&this->filename,(string *)filename);
  std::__cxx11::string::string((string *)&this->object,(string *)object);
  this->offset = offset_00;
  std::__cxx11::string::string((string *)&this->message,(string *)message);
  return;
}

Assistant:

QPDFExc::QPDFExc(
    qpdf_error_code_e error_code,
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message,
    bool zero_offset_valid) :
    std::runtime_error(
        createWhat(filename, object, (offset || zero_offset_valid ? offset : -1), message)),
    error_code(error_code),
    filename(filename),
    object(object),
    offset(offset || zero_offset_valid ? offset : -1),
    message(message)
{
}